

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitblt.c
# Opt level: O1

LispPTR N_OP_pilotbitblt(LispPTR pilot_bt_tbl,LispPTR tos)

{
  DLword *ybase;
  DLword *pDVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  DLword DVar5;
  ushort uVar6;
  ushort uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  sbyte sVar13;
  ushort uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint *puVar24;
  uint *puVar25;
  uint *puVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  uint h;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint *puVar38;
  uint *puVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint *local_d8;
  DLword *local_c8;
  uint *local_b8;
  sbyte sVar14;
  
  uVar12 = (ulong)pilot_bt_tbl;
  if ((pilot_bt_tbl & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar12);
  }
  uVar2 = Lisp_world[uVar12 + 9];
  if (uVar2 != 0 && Lisp_world[uVar12 + 8] != 0) {
    uVar3 = Lisp_world[uVar12 + 3];
    uVar4 = Lisp_world[uVar12 + 7];
    DVar5 = Lisp_world[uVar12 + 0xb];
    ScreenLocked = 1;
    local_c8 = Lisp_world +
               ((ulong)Lisp_world[uVar12 + 5] |
               (ulong)(uint)(*(int *)(Lisp_world + uVar12 + 4) << 0x10));
    ybase = Lisp_world +
            ((ulong)Lisp_world[uVar12 + 1] | (ulong)(uint)(*(int *)(Lisp_world + uVar12) << 0x10));
    uVar6 = Lisp_world[uVar12 + 6];
    uVar29 = (uint)(short)uVar6;
    uVar27 = (uint)(short)Lisp_world[uVar12 + 2];
    uVar7 = Lisp_world[uVar12 + 0xb];
    if ((uVar7 >> 0xc & 1) == 0) {
      local_11c = (uint)(short)(Lisp_world[uVar12 + 2] | uVar6);
      if ((short)DVar5 < 0) {
        uVar17 = (uint)uVar2;
        uVar9 = (uVar17 + uVar3) - 1;
        local_d8 = (uint *)((ulong)(uVar9 >> 3) + (long)ybase);
        local_100 = (uVar9 & 7) + ((uint)local_d8 & 3) * 8;
        iVar18 = local_100 - uVar17;
        uVar9 = iVar18 + 1U & 0x1f;
        local_108 = -1 << (~(byte)local_100 & 0x1f);
        local_10c = -(uint)(uVar9 == 0) | ~(-1 << (-(char)uVar9 & 0x1fU));
        local_110 = local_10c & local_108;
        uVar17 = (local_100 ^ 0xffffffff) + uVar17;
        local_104 = uVar17 >> 5;
        if ((int)uVar17 < 1) {
          local_104 = 0;
        }
        uVar17 = ((uint)uVar2 + (uint)uVar4) - 1;
        uVar16 = (ulong)(uVar17 >> 3) + (long)local_c8;
        local_e8 = (uVar17 & 7) + ((uint)uVar16 & 3) * 8;
        iVar34 = local_e8 - uVar2;
        local_b8 = (uint *)(uVar16 & 0xfffffffffffffffc);
        uVar17 = iVar34 + 1U & 0x1f;
        local_ec = iVar18 - iVar34 & 0x1f;
        uVar33 = iVar34 - iVar18 & 0x1f;
        local_e4 = ~(-1 << (sbyte)uVar33);
      }
      else {
        local_d8 = (uint *)((ulong)(uVar3 >> 3) + (long)ybase);
        uVar9 = (uVar3 & 7) + ((uint)local_d8 & 3) * 8;
        local_100 = (uVar2 + uVar9) - 1 & 0x1f;
        local_108 = -(uint)(uVar9 == 0) | -1 << (-(char)uVar9 & 0x1fU) ^ 0xffffffffU;
        local_10c = -1 << (~(byte)local_100 & 0x1f);
        local_110 = local_10c & local_108;
        local_104 = (uVar9 + uVar2 >> 5) - 1;
        uVar16 = (ulong)(uVar4 >> 3) + (long)local_c8;
        local_b8 = (uint *)(uVar16 & 0xfffffffffffffffc);
        uVar17 = (uVar4 & 7) + ((uint)uVar16 & 3) * 8;
        local_e8 = (uVar2 + uVar17) - 1 & 0x1f;
        local_ec = uVar9 - uVar17 & 0x1f;
        uVar33 = uVar17 - uVar9 & 0x1f;
        local_e4 = -(uint)(uVar33 == 0) | ~(-1 << (sbyte)uVar33);
      }
    }
    else {
      local_d8 = (uint *)((ulong)(uVar3 >> 3) + (long)ybase);
      uVar9 = (uVar3 & 7) + ((uint)local_d8 & 3) * 8;
      local_100 = (uVar2 + uVar9) - 1 & 0x1f;
      uVar33 = 0;
      local_10c = -1 << (~(byte)local_100 & 0x1f);
      local_108 = -(uint)(uVar9 == 0) | ~(-1 << (-(char)uVar9 & 0x1fU));
      local_110 = local_10c & local_108;
      local_104 = (uVar9 + uVar2 >> 5) - 1;
      uVar17 = uVar4 & 0xf;
      local_e4 = 0;
      local_e8 = 0;
      local_b8 = (uint *)0x0;
      local_ec = 0;
      local_11c = uVar27;
    }
    h = (uint)Lisp_world[uVar12 + 8];
    if (h != 0) {
      uVar4 = uVar7 >> 0xb;
      uVar15 = uVar7 >> 9 & 3;
      uVar41 = uVar6 >> 8 & 0xf;
      uVar30 = (uint)uVar2;
      iVar18 = 0x21 - uVar30;
      local_d8 = (uint *)((ulong)local_d8 & 0xfffffffffffffffc);
      uVar19 = -(uVar4 & 1);
      uVar42 = 0;
      puVar38 = local_b8;
      uVar31 = h;
LAB_00111d9d:
      local_114 = local_110;
      local_118 = local_10c;
      local_12c = local_108;
      local_130 = local_e4;
      puVar24 = local_b8;
      puVar39 = local_d8;
      uVar32 = uVar31;
      uVar36 = local_ec;
      uVar35 = local_e8;
      uVar28 = local_100;
      uVar37 = uVar9;
      uVar40 = uVar17;
      uVar22 = local_104;
      do {
        puVar26 = puVar39;
        uVar23 = local_114;
        if ((uVar7 >> 0xc & 1) == 0) {
          sVar13 = (sbyte)uVar33;
          sVar14 = (sbyte)uVar36;
          if ((short)DVar5 < 0) {
            if (uVar35 < uVar28) {
              if (uVar37 + 1 < uVar2 + uVar40) {
                puVar25 = puVar38 + -1;
                uVar42 = *puVar38;
                puVar38 = puVar38 + -2;
                uVar21 = *puVar25 << sVar13 | uVar42 >> sVar14 & local_130;
                uVar42 = *puVar25 >> sVar14 & local_130;
              }
              else {
                if (uVar28 <= uVar35) goto LAB_001120e3;
                uVar21 = *puVar38;
                puVar38 = puVar38 + -1;
                uVar21 = uVar21 >> sVar14 & local_130;
              }
            }
            else {
LAB_001120e3:
              uVar42 = *puVar38;
              puVar38 = puVar38 + -1;
              uVar21 = uVar42 << sVar13;
              uVar42 = uVar42 >> sVar14 & local_130;
            }
            uVar21 = uVar21 ^ uVar19;
            if ((int)uVar37 < iVar18) goto LAB_0011210f;
            uVar23 = *puVar39;
            switch(uVar15) {
            case 1:
              uVar21 = uVar21 & uVar23;
              break;
            case 2:
              uVar21 = uVar21 | uVar23;
              break;
            case 3:
              uVar21 = uVar21 ^ uVar23;
            }
            *puVar39 = uVar21 & local_12c | uVar23 & ~local_12c;
            puVar26 = puVar39 + -1;
            if (uVar40 == uVar37) {
              if ((uVar4 & 1) == 0) {
                switch(uVar15) {
                case 0:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      uVar23 = *puVar38;
                      puVar38 = puVar38 + -1;
                      *puVar26 = uVar23;
                      puVar26 = puVar26 + -1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 1:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 & *puVar38;
                      puVar38 = puVar38 + -1;
                      puVar26 = puVar26 + -1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 | *puVar38;
                      puVar38 = puVar38 + -1;
                      puVar26 = puVar26 + -1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 ^ *puVar38;
                      puVar38 = puVar38 + -1;
                      puVar26 = puVar26 + -1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                }
              }
              else {
                switch(uVar15) {
                case 0:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      uVar23 = *puVar38;
                      puVar38 = puVar38 + -1;
                      *puVar26 = ~uVar23;
                      puVar26 = puVar26 + -1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 1:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 & ~*puVar38;
                      puVar38 = puVar38 + -1;
                      puVar26 = puVar26 + -1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 | ~*puVar38;
                      puVar38 = puVar38 + -1;
                      puVar26 = puVar26 + -1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      uVar23 = *puVar38;
                      puVar38 = puVar38 + -1;
                      *puVar26 = ~(uVar23 ^ *puVar26);
                      puVar26 = puVar26 + -1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                }
              }
            }
            else if ((uVar4 & 1) == 0) {
              switch(uVar15) {
              case 0:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + -1;
                    uVar21 = uVar23 << sVar13 | uVar42;
                    uVar42 = uVar23 >> sVar14;
                    *puVar26 = uVar21;
                    puVar26 = puVar26 + -1;
                    iVar34 = iVar34 + -1;
                  } while (1 < iVar34);
                }
                break;
              case 1:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  uVar23 = uVar42;
                  do {
                    uVar21 = *puVar38;
                    puVar38 = puVar38 + -1;
                    uVar42 = uVar21 >> sVar14;
                    *puVar26 = *puVar26 & (uVar21 << sVar13 | uVar23);
                    puVar26 = puVar26 + -1;
                    iVar34 = iVar34 + -1;
                    uVar23 = uVar42;
                  } while (1 < iVar34);
                }
                break;
              case 2:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  puVar25 = puVar26;
                  uVar23 = uVar42;
                  do {
                    uVar21 = *puVar38;
                    puVar38 = puVar38 + -1;
                    uVar42 = uVar21 >> sVar14;
                    puVar26 = puVar25 + -1;
                    *puVar25 = uVar23 | *puVar25 | uVar21 << sVar13;
                    iVar34 = iVar34 + -1;
                    puVar25 = puVar26;
                    uVar23 = uVar42;
                  } while (1 < iVar34);
                }
                break;
              case 3:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  uVar23 = uVar42;
                  do {
                    uVar21 = *puVar38;
                    puVar38 = puVar38 + -1;
                    uVar42 = uVar21 >> sVar14;
                    *puVar26 = *puVar26 ^ (uVar21 << sVar13 | uVar23);
                    puVar26 = puVar26 + -1;
                    iVar34 = iVar34 + -1;
                    uVar23 = uVar42;
                  } while (1 < iVar34);
                }
              }
            }
            else {
              switch(uVar15) {
              case 0:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + -1;
                    uVar21 = uVar23 << sVar13 | uVar42;
                    uVar42 = uVar23 >> sVar14;
                    *puVar26 = ~uVar21;
                    puVar26 = puVar26 + -1;
                    iVar34 = iVar34 + -1;
                  } while (1 < iVar34);
                }
                break;
              case 1:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + -1;
                    uVar21 = uVar23 << sVar13 | uVar42;
                    uVar42 = uVar23 >> sVar14;
                    *puVar26 = *puVar26 & ~uVar21;
                    puVar26 = puVar26 + -1;
                    iVar34 = iVar34 + -1;
                  } while (1 < iVar34);
                }
                break;
              case 2:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + -1;
                    uVar21 = uVar23 << sVar13 | uVar42;
                    uVar42 = uVar23 >> sVar14;
                    *puVar26 = *puVar26 | ~uVar21;
                    puVar26 = puVar26 + -1;
                    iVar34 = iVar34 + -1;
                  } while (1 < iVar34);
                }
                break;
              case 3:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  puVar25 = puVar26;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + -1;
                    uVar21 = uVar23 << sVar13 | uVar42;
                    uVar42 = uVar23 >> sVar14;
                    puVar26 = puVar25 + -1;
                    *puVar25 = ~(uVar21 ^ *puVar25);
                    iVar34 = iVar34 + -1;
                    puVar25 = puVar26;
                  } while (1 < iVar34);
                }
              }
            }
            if (uVar37 != 0) {
              uVar21 = uVar42;
              if (uVar37 <= uVar40) {
                uVar21 = *puVar38 << sVar13 | uVar42;
              }
              uVar21 = uVar21 ^ uVar19;
              uVar23 = local_118;
              goto LAB_0011210f;
            }
          }
          else {
            uVar10 = *puVar38;
            if ((uVar37 < uVar40) && ((int)(0x20 - uVar30) < (int)uVar40)) {
              puVar25 = puVar38 + 1;
              puVar38 = puVar38 + 2;
              uVar21 = *puVar25 >> sVar14 & local_130 | uVar10 << sVar13;
              uVar42 = ~local_130 & *puVar25 << sVar13;
            }
            else {
              puVar38 = puVar38 + 1;
              if (uVar37 < uVar40) {
                uVar21 = uVar10 << sVar13;
              }
              else {
                uVar21 = uVar10 >> sVar14 & local_130;
                uVar42 = ~local_130 & uVar10 << sVar13;
              }
            }
            uVar21 = uVar21 ^ uVar19;
            if ((int)uVar37 < iVar18) goto LAB_0011210f;
            uVar23 = *puVar39;
            switch(uVar15) {
            case 1:
              uVar21 = uVar21 & uVar23;
              break;
            case 2:
              uVar21 = uVar21 | uVar23;
              break;
            case 3:
              uVar21 = uVar21 ^ uVar23;
            }
            *puVar39 = uVar21 & local_12c | uVar23 & ~local_12c;
            puVar26 = puVar39 + 1;
            if (uVar40 == uVar37) {
              if ((uVar4 & 1) == 0) {
                switch(uVar15) {
                case 0:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      uVar23 = *puVar38;
                      puVar38 = puVar38 + 1;
                      *puVar26 = uVar23;
                      puVar26 = puVar26 + 1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 1:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 & *puVar38;
                      puVar38 = puVar38 + 1;
                      puVar26 = puVar26 + 1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 | *puVar38;
                      puVar38 = puVar38 + 1;
                      puVar26 = puVar26 + 1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 ^ *puVar38;
                      puVar38 = puVar38 + 1;
                      puVar26 = puVar26 + 1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                }
              }
              else {
                switch(uVar15) {
                case 0:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      uVar23 = *puVar38;
                      puVar38 = puVar38 + 1;
                      *puVar26 = ~uVar23;
                      puVar26 = puVar26 + 1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 1:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 & ~*puVar38;
                      puVar38 = puVar38 + 1;
                      puVar26 = puVar26 + 1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      *puVar26 = *puVar26 | ~*puVar38;
                      puVar38 = puVar38 + 1;
                      puVar26 = puVar26 + 1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar22) {
                    iVar34 = uVar22 + 1;
                    do {
                      uVar23 = *puVar38;
                      puVar38 = puVar38 + 1;
                      *puVar26 = ~(uVar23 ^ *puVar26);
                      puVar26 = puVar26 + 1;
                      iVar34 = iVar34 + -1;
                    } while (1 < iVar34);
                  }
                }
              }
            }
            else if ((uVar4 & 1) == 0) {
              switch(uVar15) {
              case 0:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + 1;
                    uVar21 = uVar23 >> sVar14 | uVar42;
                    uVar42 = uVar23 << sVar13;
                    *puVar26 = uVar21;
                    puVar26 = puVar26 + 1;
                    iVar34 = iVar34 + -1;
                  } while (1 < iVar34);
                }
                break;
              case 1:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  uVar23 = uVar42;
                  do {
                    uVar21 = *puVar38;
                    puVar38 = puVar38 + 1;
                    uVar42 = uVar21 << sVar13;
                    *puVar26 = *puVar26 & (uVar21 >> sVar14 | uVar23);
                    puVar26 = puVar26 + 1;
                    iVar34 = iVar34 + -1;
                    uVar23 = uVar42;
                  } while (1 < iVar34);
                }
                break;
              case 2:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  puVar25 = puVar26;
                  uVar23 = uVar42;
                  do {
                    uVar21 = *puVar38;
                    puVar38 = puVar38 + 1;
                    uVar42 = uVar21 << sVar13;
                    puVar26 = puVar25 + 1;
                    *puVar25 = uVar23 | *puVar25 | uVar21 >> sVar14;
                    iVar34 = iVar34 + -1;
                    puVar25 = puVar26;
                    uVar23 = uVar42;
                  } while (1 < iVar34);
                }
                break;
              case 3:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  uVar23 = uVar42;
                  do {
                    uVar21 = *puVar38;
                    puVar38 = puVar38 + 1;
                    uVar42 = uVar21 << sVar13;
                    *puVar26 = *puVar26 ^ (uVar21 >> sVar14 | uVar23);
                    puVar26 = puVar26 + 1;
                    iVar34 = iVar34 + -1;
                    uVar23 = uVar42;
                  } while (1 < iVar34);
                }
              }
            }
            else {
              switch(uVar15) {
              case 0:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + 1;
                    uVar21 = uVar23 >> sVar14 | uVar42;
                    uVar42 = uVar23 << sVar13;
                    *puVar26 = ~uVar21;
                    puVar26 = puVar26 + 1;
                    iVar34 = iVar34 + -1;
                  } while (1 < iVar34);
                }
                break;
              case 1:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + 1;
                    uVar21 = uVar23 >> sVar14 | uVar42;
                    uVar42 = uVar23 << sVar13;
                    *puVar26 = *puVar26 & ~uVar21;
                    puVar26 = puVar26 + 1;
                    iVar34 = iVar34 + -1;
                  } while (1 < iVar34);
                }
                break;
              case 2:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + 1;
                    uVar21 = uVar23 >> sVar14 | uVar42;
                    uVar42 = uVar23 << sVar13;
                    *puVar26 = *puVar26 | ~uVar21;
                    puVar26 = puVar26 + 1;
                    iVar34 = iVar34 + -1;
                  } while (1 < iVar34);
                }
                break;
              case 3:
                if (0 < (int)uVar22) {
                  iVar34 = uVar22 + 1;
                  puVar25 = puVar26;
                  do {
                    uVar23 = *puVar38;
                    puVar38 = puVar38 + 1;
                    uVar21 = uVar23 >> sVar14 | uVar42;
                    uVar42 = uVar23 << sVar13;
                    puVar26 = puVar25 + 1;
                    *puVar25 = ~(uVar21 ^ *puVar25);
                    iVar34 = iVar34 + -1;
                    puVar25 = puVar26;
                  } while (1 < iVar34);
                }
              }
            }
            if (uVar28 == 0x1f) goto LAB_001126e3;
            uVar21 = uVar42;
            if (uVar35 <= uVar28) {
              uVar21 = *puVar38 >> sVar14 & local_130 | uVar42;
            }
            uVar21 = uVar21 ^ uVar19;
            uVar10 = *puVar26;
            uVar11 = ~local_118 & uVar10;
            uVar23 = local_118;
            switch(uVar15) {
            case 1:
              goto switchD_0011212c_caseD_1;
            case 2:
              goto switchD_0011212c_caseD_2;
            case 3:
              goto switchD_0011212c_caseD_3;
            }
switchD_0011212c_caseD_0:
            *puVar26 = uVar23 & uVar21 | uVar11;
          }
        }
        else {
          uVar33 = uVar40 - uVar37 & 0xf;
          uVar21 = CONCAT22(*local_c8,*local_c8) << (sbyte)uVar33;
          uVar21 = (uVar21 >> 0x10 | uVar21) ^ (int)(short)-(uVar4 & 1);
          if ((int)uVar37 < iVar18) goto LAB_0011210f;
          uVar23 = *puVar39;
          uVar10 = ~local_12c & uVar23;
          switch(uVar15) {
          case 0:
            *puVar39 = uVar21 & local_12c | uVar10;
            switch(uVar15) {
            case 0:
              goto switchD_00111ff1_caseD_0;
            case 1:
switchD_00111ff1_caseD_1:
              puVar26 = puVar39 + 1;
              if (0 < (int)uVar22) {
                iVar34 = uVar22 + 1;
                do {
                  *puVar26 = *puVar26 & uVar21;
                  puVar26 = puVar26 + 1;
                  iVar34 = iVar34 + -1;
                } while (1 < iVar34);
                break;
              }
              goto LAB_001120ae;
            case 2:
switchD_00111ff1_caseD_2:
              puVar26 = puVar39 + 1;
              if ((int)uVar22 < 1) goto LAB_001120ae;
              iVar34 = uVar22 + 1;
              do {
                *puVar26 = *puVar26 | uVar21;
                puVar26 = puVar26 + 1;
                iVar34 = iVar34 + -1;
              } while (1 < iVar34);
              break;
            case 3:
switchD_00111ff1_caseD_3:
              puVar26 = puVar39 + 1;
              if ((int)uVar22 < 1) goto LAB_001120ae;
              iVar34 = uVar22 + 1;
              do {
                *puVar26 = *puVar26 ^ uVar21;
                puVar26 = puVar26 + 1;
                iVar34 = iVar34 + -1;
              } while (1 < iVar34);
            }
            goto LAB_001120b1;
          case 1:
            *puVar39 = uVar23 & uVar21 & local_12c | uVar10;
            switch(uVar15) {
            case 1:
              goto switchD_00111ff1_caseD_1;
            case 2:
              goto switchD_00111ff1_caseD_2;
            case 3:
              goto switchD_00111ff1_caseD_3;
            }
            break;
          case 2:
            *puVar39 = (uVar23 | uVar21) & local_12c | uVar10;
            switch(uVar15) {
            case 1:
              goto switchD_00111ff1_caseD_1;
            case 2:
              goto switchD_00111ff1_caseD_2;
            case 3:
              goto switchD_00111ff1_caseD_3;
            }
            break;
          case 3:
            *puVar39 = (uVar23 ^ uVar21) & local_12c | uVar10;
            switch(uVar15) {
            case 1:
              goto switchD_00111ff1_caseD_1;
            case 2:
              goto switchD_00111ff1_caseD_2;
            case 3:
              goto switchD_00111ff1_caseD_3;
            }
          }
switchD_00111ff1_caseD_0:
          puVar26 = puVar39 + 1;
          if ((int)uVar22 < 1) {
LAB_001120ae:
            puVar26 = puVar39 + 1;
          }
          else {
            iVar34 = uVar22 + 1;
            do {
              *puVar26 = uVar21;
              puVar26 = puVar26 + 1;
              iVar34 = iVar34 + -1;
            } while (1 < iVar34);
          }
LAB_001120b1:
          uVar23 = local_118;
          if (uVar28 != 0x1f) {
LAB_0011210f:
            uVar10 = *puVar26;
            uVar11 = ~uVar23 & uVar10;
            switch(uVar15) {
            case 1:
switchD_0011212c_caseD_1:
              uVar21 = uVar21 & uVar10;
              break;
            case 2:
switchD_0011212c_caseD_2:
              uVar21 = uVar21 | uVar10;
              break;
            case 3:
switchD_0011212c_caseD_3:
              uVar21 = uVar21 ^ uVar10;
            }
            goto switchD_0011212c_caseD_0;
          }
        }
LAB_001126e3:
        uVar23 = (uint)uVar2;
        if ((uVar7 >> 0xc & 1) != 0) goto LAB_00112bfe;
        if ((short)DVar5 < 0) {
          lVar20 = (long)((int)uVar27 >> 5);
          if ((local_11c & 0x1f) != 0) {
            uVar22 = uVar28 + uVar27;
            lVar20 = -(ulong)(0x1f - uVar22 >> 5);
            if (-1 < (int)uVar22) {
              lVar20 = 0;
            }
            uVar28 = uVar22 & 0x1f;
            local_12c = -1 << (~(byte)uVar28 & 0x1f);
            uVar37 = (uVar22 - uVar2) + 1 & 0x1f;
            local_118 = -(uint)(uVar37 == 0) | ~(-1 << (-(char)uVar37 & 0x1fU));
            local_114 = local_118 & local_12c;
            uVar23 = (uVar28 ^ 0xffffffff) + (uint)uVar2;
            uVar22 = uVar23 >> 5;
            if ((int)uVar23 < 1) {
              uVar22 = 0;
            }
          }
          uVar12 = (long)((int)uVar29 >> 5);
          if ((local_11c & 0x1f) != 0) {
            uVar33 = uVar35 + uVar29;
            uVar12 = (ulong)(uVar33 >> 5);
            if ((int)uVar33 < 0) {
              uVar12 = -(ulong)(0x1f - uVar33 >> 5);
            }
            uVar35 = uVar33 & 0x1f;
            local_128 = (uint)uVar2;
            uVar36 = (uVar33 - local_128) + 1;
            uVar40 = uVar36 & 0x1f;
            uVar33 = uVar36 - uVar37 & 0x1f;
            uVar36 = uVar37 - uVar36 & 0x1f;
            local_130 = ~(-1 << (sbyte)uVar33);
          }
        }
        else {
          uVar21 = uVar27;
          if ((local_11c & 0x1f) != 0) {
            uVar21 = uVar37 + uVar27;
            uVar37 = uVar21 & 0x1f;
            uVar28 = (uVar37 + uVar23) - 1 & 0x1f;
            local_12c = -(uint)(uVar37 == 0) | ~(-1 << (-(char)uVar37 & 0x1fU));
            local_118 = -1 << (~(byte)uVar28 & 0x1f);
            local_114 = local_118 & local_12c;
            uVar22 = (uVar37 + uVar23 >> 5) - 1;
          }
          uVar23 = uVar29;
          if ((local_11c & 0x1f) != 0) {
            uVar23 = uVar40 + uVar29;
            uVar40 = uVar23 & 0x1f;
            uVar35 = uVar30 + 0x1f + uVar23 & 0x1f;
            uVar33 = uVar23 - uVar37 & 0x1f;
            uVar36 = uVar37 - uVar23 & 0x1f;
            local_130 = -(uint)(uVar33 == 0) | ~(-1 << (sbyte)uVar33);
          }
          lVar20 = (long)((int)uVar21 >> 5);
          uVar12 = (long)((int)uVar23 >> 5);
        }
        puVar39 = puVar39 + lVar20;
        puVar24 = puVar24 + uVar12;
        bVar8 = (int)uVar32 < 2;
        puVar38 = puVar24;
        uVar32 = uVar32 - 1;
        if (bVar8) break;
      } while( true );
    }
LAB_00112ce1:
    flush_display_lineregion((ulong)uVar3,ybase,(uint)uVar2,h);
    ScreenLocked = 0;
  }
  return pilot_bt_tbl;
LAB_00112bfe:
  uVar22 = uVar27;
  if ((local_11c & 0x1f) != 0) {
    uVar22 = uVar9 + uVar27;
    uVar9 = uVar22 & 0x1f;
    local_100 = (uVar9 + uVar23) - 1 & 0x1f;
    local_108 = -(uint)(uVar9 == 0) | ~(-1 << (-(char)uVar9 & 0x1fU));
    local_10c = -1 << (~(byte)local_100 & 0x1f);
    local_110 = local_10c & local_108;
    local_104 = (uVar9 + uVar23 >> 5) - 1;
  }
  local_d8 = local_d8 + ((int)uVar22 >> 5);
  pDVar1 = local_c8 + -(ulong)(uVar6 & 0xf);
  bVar8 = (int)(uVar6 & 0xf) <= (int)uVar41;
  uVar41 = uVar41 + 1;
  local_c8 = local_c8 + 1;
  if (bVar8) {
    uVar41 = 0;
    local_c8 = pDVar1;
  }
  bVar8 = (int)uVar31 < 2;
  uVar31 = uVar32 - 1;
  if (bVar8) goto LAB_00112ce1;
  goto LAB_00111d9d;
}

Assistant:

LispPTR N_OP_pilotbitblt(LispPTR pilot_bt_tbl, LispPTR tos)
{
  PILOTBBT *pbt;
  DLword *srcbase, *dstbase;
#if defined(SUNDISPLAY) || defined(DOS)
  int displayflg;
#endif
  int sx, dx, w, h, srcbpl, dstbpl, backwardflg;
  int src_comp, op, gray, num_gray, curr_gray_line;

#ifdef INIT

  /* for init, we have to initialize the pointers at the
     first call to pilotbitblt or we die.  If we do it
     earlier we die also.  We set a new flag so we don't
     do it more than once which is a lose also.

     I put this in an ifdef so there won't be any extra
     code when making a regular LDE.  */

  if (!kbd_for_makeinit) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }

#endif

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(pilot_bt_tbl);

  w = pbt->pbtwidth;
  h = pbt->pbtheight;
  if ((h <= 0) || (w <= 0)) return (pilot_bt_tbl);
  dx = pbt->pbtdestbit;
  sx = pbt->pbtsourcebit;
  backwardflg = pbt->pbtbackward;
/* if displayflg != 0 then source or destination is DisplayBitMap */
#ifdef DOS
  currentdsp->device.locked++;
#else
  ScreenLocked = T;
#endif /* DOS */

#if defined(SUNDISPLAY) || defined(DOS)
  displayflg = cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (dx >> 4)), w, h, backwardflg) ||
               cursorin(pbt->pbtsourcehi, (pbt->pbtsourcelo + (sx >> 4)), w, h, backwardflg);
#endif /* SUNDISPLAY */

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));
  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  srcbpl = pbt->pbtsourcebpl;
  dstbpl = pbt->pbtdestbpl;
  src_comp = pbt->pbtsourcetype;
  op = pbt->pbtoperation;
  gray = pbt->pbtusegray;
  num_gray = ((TEXTUREBBT *)pbt)->pbtgrayheightlessone + 1;
  curr_gray_line = ((TEXTUREBBT *)pbt)->pbtgrayoffset;

#ifdef DOS
  if (displayflg) (currentdsp->mouse_invisible)(currentdsp, IOPage);
  ;
#endif /* SUNDISPLAY / DOS */

  new_bitblt_code;

#ifdef DOS
      flush_display_lineregion(dx, dstbase, w, h);
  if (displayflg) (currentdsp->mouse_visible)(IOPage->dlmousex, IOPage->dlmousey);
#endif /* SUNDISPLAY / DOS */

#if defined(XWINDOW) || defined(SDL)
  flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */

#ifdef DOS
  currentdsp->device.locked--;
#else
  ScreenLocked = NIL;
#endif /* DOS */

  return (pilot_bt_tbl);

}